

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

void __thiscall QtMWidgets::SwitchPrivate::initOffset(SwitchPrivate *this,QRect *r)

{
  int iVar1;
  
  iVar1 = 0;
  if (AcceptedUncheck < this->state) {
    if (1 < this->state - NotAcceptedCheck) {
      return;
    }
    iVar1 = ~r->x1 + r->x2 + this->radius * -2;
  }
  this->offset = iVar1;
  return;
}

Assistant:

void
SwitchPrivate::initOffset( const QRect & r )
{
	switch( state )
	{
		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
			offset = r.width() - radius * 2 - 2;
		break;

		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
			offset = 0;
		break;
	}
}